

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_block_manager.cpp
# Opt level: O1

void __thiscall
duckdb::PartialBlock::PartialBlock
          (PartialBlock *this,PartialBlockState state,BlockManager *block_manager,
          shared_ptr<duckdb::BlockHandle,_true> *block_handle)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  this->_vptr_PartialBlock = (_func_int **)&PTR__PartialBlock_024a3460;
  (this->state).block_id = state.block_id;
  (this->state).block_size = state.block_size;
  (this->state).offset = state.offset;
  (this->state).block_use_count = state.block_use_count;
  *(undefined4 *)&(this->state).field_0x14 = state._20_4_;
  (this->uninitialized_regions).
  super_vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>.
  super__Vector_base<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->uninitialized_regions).
  super_vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>.
  super__Vector_base<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->uninitialized_regions).
  super_vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>.
  super__Vector_base<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->block_manager = block_manager;
  (this->block_handle).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (block_handle->internal).
           super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (block_handle->internal).
           super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->block_handle).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      return;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  return;
}

Assistant:

PartialBlock::PartialBlock(PartialBlockState state, BlockManager &block_manager,
                           const shared_ptr<BlockHandle> &block_handle)
    : state(state), block_manager(block_manager), block_handle(block_handle) {
}